

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall embree::Application::~Application(Application *this)

{
  code *pcVar1;
  Application *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Application::~Application()
  {
    assert(instance == this);
    instance = nullptr;
  }